

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dag_builder.h
# Opt level: O0

void __thiscall ccs::DagBuilder::DagBuilder(DagBuilder *this,shared_ptr<ccs::CcsTracer> *tracer)

{
  Node *this_00;
  element_type *node;
  shared_ptr<ccs::CcsTracer> local_28;
  shared_ptr<ccs::CcsTracer> *local_18;
  shared_ptr<ccs::CcsTracer> *tracer_local;
  DagBuilder *this_local;
  
  this->nextProperty_ = 0;
  local_18 = tracer;
  tracer_local = (shared_ptr<ccs::CcsTracer> *)this;
  this_00 = (Node *)operator_new(0x108);
  std::shared_ptr<ccs::CcsTracer>::shared_ptr(&local_28,tracer);
  Node::Node(this_00,&local_28);
  std::shared_ptr<ccs::Node>::shared_ptr<ccs::Node,void>(&this->root_,this_00);
  std::shared_ptr<ccs::CcsTracer>::~shared_ptr(&local_28);
  node = std::__shared_ptr_access<ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                   ((__shared_ptr_access<ccs::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                    &this->root_);
  BuildContext::descendant((BuildContext *)&this->buildContext_,this,node);
  return;
}

Assistant:

DagBuilder(std::shared_ptr<CcsTracer> tracer) :
    nextProperty_(0),
    root_(new Node(std::move(tracer))),
    buildContext_(BuildContext::descendant(*this, *root_)) {}